

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenSteerDemo.cpp
# Opt level: O0

void anon_unknown.dwarf_c3f7::mouseMotionFunc(GLFWwindow *window,double x,double y)

{
  int iVar1;
  float fVar2;
  float fVar3;
  double in_XMM0_Qa;
  double in_XMM1_Qa;
  Vec3 cameraAdjustment;
  float dy;
  float dx;
  float rSpeed;
  float dSpeed;
  Vec3 *in_stack_00000288;
  Camera *in_stack_00000290;
  float local_34;
  float local_30;
  float in_stack_ffffffffffffffd4;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  
  OpenSteer::OpenSteerDemo::mouseX = (int)in_XMM0_Qa;
  OpenSteer::OpenSteerDemo::mouseY = (int)in_XMM1_Qa;
  iVar1 = glfwGetMouseButton((GLFWwindow *)
                             CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                             (int)in_stack_ffffffffffffffd4);
  if ((iVar1 != 0) &&
     ((((anonymous_namespace)::gMouseAdjustingCameraAngle & 1) != 0 ||
      (((anonymous_namespace)::gMouseAdjustingCameraRadius & 1) != 0)))) {
    fVar2 = (float)(in_XMM0_Qa - (double)(anonymous_namespace)::gMouseAdjustingCameraLastX);
    fVar3 = (float)(in_XMM1_Qa - (double)(anonymous_namespace)::gMouseAdjustingCameraLastY);
    (anonymous_namespace)::gMouseAdjustingCameraLastX = (int)in_XMM0_Qa;
    (anonymous_namespace)::gMouseAdjustingCameraLastY = (int)in_XMM1_Qa;
    OpenSteer::Vec3::Vec3((Vec3 *)&local_34);
    if (((anonymous_namespace)::gMouseAdjustingCameraAngle & 1) != 0) {
      local_34 = fVar2 * -0.005;
      local_30 = fVar3 * 0.005;
    }
    OpenSteer::Camera::mouseAdjustOffset(in_stack_00000290,in_stack_00000288);
  }
  return;
}

Assistant:

void 
    mouseMotionFunc(GLFWwindow* window, double x, double y)
    {
        OpenSteer::OpenSteerDemo::mouseX = static_cast<int>(x);
        OpenSteer::OpenSteerDemo::mouseY = static_cast<int>(y);

        if (glfwGetMouseButton(window, 0))
        {
            // are we currently in the process of mouse-adjusting the camera?
            if (gMouseAdjustingCameraAngle || gMouseAdjustingCameraRadius)
            {
                // speed factors to map from mouse movement in pixels to 3d motion
                const float dSpeed = 0.005f;
                const float rSpeed = 0.01f;

                // XY distance (in pixels) that mouse moved since last update
                const float dx = static_cast<float>(x - gMouseAdjustingCameraLastX);
                const float dy = static_cast<float>(y - gMouseAdjustingCameraLastY);
                gMouseAdjustingCameraLastX = static_cast<int>(x);
                gMouseAdjustingCameraLastY = static_cast<int>(y);

                OpenSteer::Vec3 cameraAdjustment;

                // set XY values according to mouse motion on screen space
                if (gMouseAdjustingCameraAngle)
                {
                    cameraAdjustment.x = dx * -dSpeed;
                    cameraAdjustment.y = dy * +dSpeed;
                }

                // set Z value according vertical to mouse motion
                if (gMouseAdjustingCameraRadius)
                {
                    cameraAdjustment.z = dy * rSpeed;
                }

                // pass adjustment vector to camera's mouse adjustment routine
                OpenSteer::OpenSteerDemo::camera.mouseAdjustOffset (cameraAdjustment);
            }
        }
    }